

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

JavascriptArray *
Js::JavascriptArray::CreateArrayFromConstructor
          (RecyclableObject *constructor,uint32 length,ScriptContext *scriptContext)

{
  JavascriptArray *pJVar1;
  
  pJVar1 = JavascriptLibrary::CreateArray((((constructor->type).ptr)->javascriptLibrary).ptr,length)
  ;
  return pJVar1;
}

Assistant:

JavascriptArray* JavascriptArray::CreateArrayFromConstructor(RecyclableObject* constructor, uint32 length, ScriptContext* scriptContext)
    {
        JavascriptLibrary* library = constructor->GetLibrary();

        // Create the Array object we'll return - this is the only way to create an object which is an exotic Array object.
        // Note: We need to use the library from the ScriptContext of the constructor, not the currently executing function.
        //       This is for the case where a built-in @@create method from a different JavascriptLibrary is installed on
        //       constructor.
        return library->CreateArray(length);
    }